

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::startElement(XmlWriter *this,string *name)

{
  ostream *poVar1;
  ostream *poVar2;
  string *name_local;
  XmlWriter *this_local;
  
  ensureTagClosed(this);
  newlineIfNecessary(this);
  poVar1 = stream(this);
  poVar2 = std::operator<<((ostream *)poVar1,(string *)&this->m_indent);
  poVar2 = std::operator<<(poVar2,"<");
  std::operator<<(poVar2,(string *)name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_tags,name);
  std::__cxx11::string::operator+=((string *)&this->m_indent,"  ");
  this->m_tagIsOpen = true;
  return this;
}

Assistant:

XmlWriter& startElement( std::string const& name ) {
            ensureTagClosed();
            newlineIfNecessary();
            stream() << m_indent << "<" << name;
            m_tags.push_back( name );
            m_indent += "  ";
            m_tagIsOpen = true;
            return *this;
        }